

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O1

int arkStep_SetOrder(ARKodeMem ark_mem,int ord)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeARKStepMem local_40;
  long local_38;
  long local_30;
  
  iVar1 = arkStep_AccessStepMem(ark_mem,"arkStep_SetOrder",&local_40);
  if (iVar1 == 0) {
    iVar1 = 4;
    if (0 < ord) {
      iVar1 = ord;
    }
    local_40->q = iVar1;
    local_40->stages = 0;
    iVar1 = 0;
    local_40->p = 0;
    local_40->istage = 0;
    ARKodeButcherTable_Space(local_40->Be,&local_38,&local_30);
    ARKodeButcherTable_Free(local_40->Be);
    local_40->Be = (ARKodeButcherTable)0x0;
    ark_mem->liw = ark_mem->liw - local_38;
    ark_mem->lrw = ark_mem->lrw - local_30;
    ARKodeButcherTable_Space(local_40->Bi,&local_38,&local_30);
    ARKodeButcherTable_Free(local_40->Bi);
    local_40->Bi = (ARKodeButcherTable)0x0;
    ark_mem->liw = ark_mem->liw - local_38;
    ark_mem->lrw = ark_mem->lrw - local_30;
  }
  return iVar1;
}

Assistant:

int arkStep_SetOrder(ARKodeMem ark_mem, int ord)
{
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set user-provided value, or default, depending on argument */
  if (ord <= 0) { step_mem->q = Q_DEFAULT; }
  else { step_mem->q = ord; }

  /* clear Butcher tables, since user is requesting a change in method
     or a reset to defaults.  Tables will be set in ARKInitialSetup. */
  step_mem->stages = 0;
  step_mem->istage = 0;
  step_mem->p      = 0;

  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Be);
  step_mem->Be = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Bi);
  step_mem->Bi = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  return (ARK_SUCCESS);
}